

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int resolveOrderGroupBy(NameContext *pNC,Select *pSelect,ExprList *pOrderBy,char *zType)

{
  Expr *pExpr;
  int iVar1;
  Expr *p;
  Expr *pE;
  long lVar2;
  int iVar3;
  long lVar4;
  ExprList_item *pEVar5;
  int iCol;
  char *local_58;
  int local_4c;
  Parse *local_48;
  NameContext *local_40;
  ExprList *local_38;
  
  if (pOrderBy == (ExprList *)0x0) {
    return 0;
  }
  local_4c = pSelect->pEList->nExpr;
  local_48 = pNC->pParse;
  pEVar5 = pOrderBy->a;
  iVar3 = 0;
  local_58 = zType;
  local_40 = pNC;
  local_38 = pOrderBy;
  do {
    if (local_38->nExpr <= iVar3) {
      iVar3 = sqlite3ResolveOrderGroupBy(local_48,pSelect,local_38,local_58);
      return iVar3;
    }
    pExpr = pEVar5->pExpr;
    p = sqlite3ExprSkipCollate(pExpr);
    if ((*local_58 == 'G') ||
       (iCol = resolveAsName((Parse *)pSelect->pEList,(ExprList *)p,pE), iCol < 1)) {
      iVar1 = sqlite3ExprIsInteger(p,&iCol);
      if (iVar1 != 0) {
        if (iCol - 0x10000U < 0xffff0001) {
          resolveOutOfRangeError(local_48,local_58,iVar3 + 1,local_4c);
          return 1;
        }
        goto LAB_001539d5;
      }
      (pEVar5->u).x.iOrderByCol = 0;
      iVar1 = sqlite3ResolveExprNames(local_40,pExpr);
      if (iVar1 != 0) {
        return 1;
      }
      lVar2 = 0;
      for (lVar4 = 0; lVar4 < pSelect->pEList->nExpr; lVar4 = lVar4 + 1) {
        iVar1 = sqlite3ExprCompare(pExpr,*(Expr **)((long)&pSelect->pEList->a->pExpr + lVar2),-1);
        if (iVar1 == 0) {
          (pEVar5->u).x.iOrderByCol = (short)lVar4 + 1;
        }
        lVar2 = lVar2 + 0x20;
      }
    }
    else {
LAB_001539d5:
      (pEVar5->u).x.iOrderByCol = (u16)iCol;
    }
    iVar3 = iVar3 + 1;
    pEVar5 = pEVar5 + 1;
  } while( true );
}

Assistant:

static int resolveOrderGroupBy(
  NameContext *pNC,     /* The name context of the SELECT statement */
  Select *pSelect,      /* The SELECT statement holding pOrderBy */
  ExprList *pOrderBy,   /* An ORDER BY or GROUP BY clause to resolve */
  const char *zType     /* Either "ORDER" or "GROUP", as appropriate */
){
  int i, j;                      /* Loop counters */
  int iCol;                      /* Column number */
  struct ExprList_item *pItem;   /* A term of the ORDER BY clause */
  Parse *pParse;                 /* Parsing context */
  int nResult;                   /* Number of terms in the result set */

  if( pOrderBy==0 ) return 0;
  nResult = pSelect->pEList->nExpr;
  pParse = pNC->pParse;
  for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
    Expr *pE = pItem->pExpr;
    Expr *pE2 = sqlite3ExprSkipCollate(pE);
    if( zType[0]!='G' ){
      iCol = resolveAsName(pParse, pSelect->pEList, pE2);
      if( iCol>0 ){
        /* If an AS-name match is found, mark this ORDER BY column as being
        ** a copy of the iCol-th result-set column.  The subsequent call to
        ** sqlite3ResolveOrderGroupBy() will convert the expression to a
        ** copy of the iCol-th result-set expression. */
        pItem->u.x.iOrderByCol = (u16)iCol;
        continue;
      }
    }
    if( sqlite3ExprIsInteger(pE2, &iCol) ){
      /* The ORDER BY term is an integer constant.  Again, set the column
      ** number so that sqlite3ResolveOrderGroupBy() will convert the
      ** order-by term to a copy of the result-set expression */
      if( iCol<1 || iCol>0xffff ){
        resolveOutOfRangeError(pParse, zType, i+1, nResult);
        return 1;
      }
      pItem->u.x.iOrderByCol = (u16)iCol;
      continue;
    }

    /* Otherwise, treat the ORDER BY term as an ordinary expression */
    pItem->u.x.iOrderByCol = 0;
    if( sqlite3ResolveExprNames(pNC, pE) ){
      return 1;
    }
    for(j=0; j<pSelect->pEList->nExpr; j++){
      if( sqlite3ExprCompare(pE, pSelect->pEList->a[j].pExpr, -1)==0 ){
        pItem->u.x.iOrderByCol = j+1;
      }
    }
  }
  return sqlite3ResolveOrderGroupBy(pParse, pSelect, pOrderBy, zType);
}